

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  bool local_1a;
  char local_19;
  char **ppcStack_18;
  char ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_19 = '\0';
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  do {
    InitVariables();
    GetInput();
    CalcInfo();
    CreateCache();
    FileTest();
    PrintOutput();
    this = std::operator<<((ostream *)&std::cout,"Continue/Exit(C/E)");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,&local_19);
    local_1a = local_19 != 'e' && local_19 != 'E';
  } while (local_1a);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	char ch = '\0';

	do
	{
		InitVariables();
		GetInput();
		CalcInfo();
		CreateCache();
		FileTest();
		PrintOutput();
		std::cout << "Continue/Exit(C/E)" << std::endl;
		std::cin >> ch;
	} while ((ch != 'e') && (ch != 'E'));

	return 0;
}